

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_example.cpp
# Opt level: O2

void getdir(string *dir,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *files)

{
  DIR *__dirp;
  ostream *poVar1;
  int *piVar2;
  dirent *pdVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_29;
  
  __dirp = opendir((dir->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Error(");
    piVar2 = __errno_location();
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*piVar2);
    poVar1 = std::operator<<(poVar1,") opening ");
    poVar1 = std::operator<<(poVar1,(string *)dir);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  while( true ) {
    pdVar3 = readdir(__dirp);
    if (pdVar3 == (dirent *)0x0) break;
    std::__cxx11::string::string((string *)&local_50,pdVar3->d_name,&local_29);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&local_50)
    ;
    std::__cxx11::string::~string((string *)&local_50);
  }
  closedir(__dirp);
  return;
}

Assistant:

void getdir (std::string dir, std::vector<std::string> &files)
{
    DIR *dp;
    struct dirent *dirp;
    if((dp  = opendir(dir.c_str())) == NULL) {
        std::cout << "Error(" << errno << ") opening " << dir << std::endl;
    }

    while ((dirp = readdir(dp)) != NULL) {
        files.push_back(std::string(dirp->d_name));
    }
    closedir(dp);
}